

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_poscall(lua_State *L,CallInfo *ci,StkId firstResult,int nres)

{
  ushort uVar1;
  StkId pTVar2;
  long lVar3;
  GCObject *pGVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CallInfo *pCVar8;
  long lVar10;
  LuaType *pLVar11;
  uint uVar12;
  TValue *pTVar13;
  bool bVar14;
  ulong uVar9;
  
  if (L->magic != '*') {
    __assert_fail("L->magic == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x18a,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
  }
  if (ci->magic != '*') {
    __assert_fail("ci->magic == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x18b,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
  }
  uVar1 = ci->nresults;
  uVar12 = (uint)(short)uVar1;
  if ((L->hookmask & 6) == 0) {
    pCVar8 = ci->previous;
    pTVar13 = firstResult;
  }
  else {
    if ((L->hookmask & 2) != 0) {
      pTVar2 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar2) + (long)L->stack);
    }
    pCVar8 = ci->previous;
    L->oldpc = (pCVar8->u).l.savedpc;
    pTVar13 = firstResult;
  }
  uVar5 = 1;
  pTVar2 = ci->func;
  L->ci = pCVar8;
  uVar6 = (uint)uVar1;
  if (uVar1 != 0) {
    if (uVar6 == 1) {
      if (nres == 0) {
        pTVar13 = &luaO_nilobject_;
      }
      pGVar4 = (pTVar13->value_).gc;
      (pTVar2->value_).gc = pGVar4;
      uVar1 = pTVar13->tt_;
      pTVar2->tt_ = uVar1;
      uVar5 = 1;
      uVar6 = uVar5;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)pGVar4->tt ||
          ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x165,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
      }
    }
    else if (uVar6 == 0xffff) {
      uVar5 = 0;
      for (lVar10 = 0; uVar6 = nres, (ulong)(uint)(~(nres >> 0x1f) & nres) << 4 != lVar10;
          lVar10 = lVar10 + 0x10) {
        lVar3 = *(long *)((long)&pTVar13->value_ + lVar10);
        *(long *)((long)&pTVar2->value_ + lVar10) = lVar3;
        uVar1 = *(ushort *)((long)&pTVar13->tt_ + lVar10);
        *(ushort *)((long)&pTVar2->tt_ + lVar10) = uVar1;
        if (((short)uVar1 < 0) &&
           (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar3 + 8) ||
            ((*(byte *)(lVar3 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x16b,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
        }
      }
    }
    else {
      uVar6 = uVar12;
      if (nres < (int)uVar12) {
        uVar7 = ~(nres >> 0x1f) & nres;
        uVar9 = (ulong)uVar7;
        for (lVar10 = 0; uVar9 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
          lVar3 = *(long *)((long)&pTVar13->value_ + lVar10);
          *(long *)((long)&pTVar2->value_ + lVar10) = lVar3;
          uVar1 = *(ushort *)((long)&pTVar13->tt_ + lVar10);
          *(ushort *)((long)&pTVar2->tt_ + lVar10) = uVar1;
          if (((short)uVar1 < 0) &&
             (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar3 + 8) ||
              ((*(byte *)(lVar3 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x177,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
          }
        }
        pLVar11 = &pTVar2[uVar9].tt_;
        if ((int)uVar7 < (int)uVar12) {
          uVar7 = uVar12;
        }
        lVar10 = uVar7 - uVar9;
        while (bVar14 = lVar10 != 0, lVar10 = lVar10 + -1, bVar14) {
          *pLVar11 = 0;
          pLVar11 = pLVar11 + 8;
        }
      }
      else {
        for (lVar10 = 0; (ulong)(~((int)uVar12 >> 0x1f) & uVar12) << 4 != lVar10;
            lVar10 = lVar10 + 0x10) {
          lVar3 = *(long *)((long)&pTVar13->value_ + lVar10);
          *(long *)((long)&pTVar2->value_ + lVar10) = lVar3;
          uVar1 = *(ushort *)((long)&pTVar13->tt_ + lVar10);
          *(ushort *)((long)&pTVar2->tt_ + lVar10) = uVar1;
          if (((short)uVar1 < 0) &&
             (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar3 + 8) ||
              ((*(byte *)(lVar3 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x173,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
          }
        }
      }
    }
  }
  L->top = pTVar2 + (int)uVar6;
  return uVar5;
}

Assistant:

int luaD_poscall (lua_State *L, CallInfo *ci, StkId firstResult, int nres) {
  StkId res;
  lua_assert(L->magic == 42);
  lua_assert(ci->magic == 42);
  int wanted = ci->nresults;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  L->ci = ci->previous;  /* back to caller */
  /* move results to proper place */
  return moveresults(L, firstResult, res, nres, wanted);
}